

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ParseDefineFlag(cmMakefile *this,string *def,bool remove)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  PolicyID id;
  string ndefs;
  char *define;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defs;
  string local_90;
  pointer local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_48;
  
  if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::valid == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid),
     iVar4 != 0)) {
    ParseDefineFlag::valid.regmatch.startp[0] = (char *)0x0;
    ParseDefineFlag::valid.regmatch.endp[0] = (char *)0x0;
    ParseDefineFlag::valid.regmatch.searchstring = (char *)0x0;
    ParseDefineFlag::valid.program = (char *)0x0;
    cmsys::RegularExpression::compile(&ParseDefineFlag::valid,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$")
    ;
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::valid,&__dso_handle)
    ;
    __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::valid);
  }
  bVar2 = cmsys::RegularExpression::find
                    (&ParseDefineFlag::valid,(def->_M_dataplus)._M_p,
                     &ParseDefineFlag::valid.regmatch);
  if (bVar2) {
    if ((ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial == '\0') &&
       (iVar4 = __cxa_guard_acquire(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial),
       iVar4 != 0)) {
      ParseDefineFlag::trivial.regmatch.startp[0] = (char *)0x0;
      ParseDefineFlag::trivial.regmatch.endp[0] = (char *)0x0;
      ParseDefineFlag::trivial.regmatch.searchstring = (char *)0x0;
      ParseDefineFlag::trivial.program = (char *)0x0;
      cmsys::RegularExpression::compile
                (&ParseDefineFlag::trivial,"^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseDefineFlag::trivial,
                   &__dso_handle);
      __cxa_guard_release(&ParseDefineFlag(std::__cxx11::string_const&,bool)::trivial);
    }
    bVar2 = cmsys::RegularExpression::find
                      (&ParseDefineFlag::trivial,(def->_M_dataplus)._M_p,
                       &ParseDefineFlag::trivial.regmatch);
    if (bVar2) {
LAB_0017f8ce:
      local_70 = (def->_M_dataplus)._M_p + 2;
      if (remove) {
        paVar1 = &local_90.field_2;
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"COMPILE_DEFINITIONS","");
        __s = GetProperty(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (__s != (char *)0x0) {
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_90._M_dataplus._M_p = (pointer)paVar1;
          sVar5 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar5);
          cmSystemTools::ExpandListArgument(&local_90,&local_68,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          local_48._M_string_length =
               (size_type)
               std::
               __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                         ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )local_68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                          (_Iter_equals_val<const_char_*const>)&local_70);
          local_48._M_dataplus._M_p =
               (pointer)local_68.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    (&local_90,
                     (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_48,";");
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"COMPILE_DEFINITIONS","");
          SetProperty(this,&local_48,local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
        }
      }
      else {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"COMPILE_DEFINITIONS","");
        AppendProperty(this,&local_90,local_70,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      return true;
    }
    PVar3 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0005,false);
    if (PVar3 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_90,(cmPolicies *)0x5,id);
      IssueMessage(this,FATAL_ERROR,&local_90);
    }
    else {
      if (PVar3 == OLD) {
        return false;
      }
      if (PVar3 != WARN) goto LAB_0017f8ce;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_90,(cmPolicies *)0x5,id);
      IssueMessage(this,AUTHOR_WARNING,&local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool cmMakefile::ParseDefineFlag(std::string const& def, bool remove)
{
  // Create a regular expression to match valid definitions.
  static cmsys::RegularExpression valid("^[-/]D[A-Za-z_][A-Za-z0-9_]*(=.*)?$");

  // Make sure the definition matches.
  if (!valid.find(def)) {
    return false;
  }

  // Definitions with non-trivial values require a policy check.
  static cmsys::RegularExpression trivial(
    "^[-/]D[A-Za-z_][A-Za-z0-9_]*(=[A-Za-z0-9_.]+)?$");
  if (!trivial.find(def)) {
    // This definition has a non-trivial value.
    switch (this->GetPolicyStatus(cmPolicies::CMP0005)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0005));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to not escape the value.  We should not
        // convert the definition to use the property.
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0005));
        return false;
      case cmPolicies::NEW:
        // NEW behavior is to escape the value.  Proceed to convert it
        // to an entry in the property.
        break;
    }
  }

  // Get the definition part after the flag.
  const char* define = def.c_str() + 2;

  if (remove) {
    if (const char* cdefs = this->GetProperty("COMPILE_DEFINITIONS")) {
      // Expand the list.
      std::vector<std::string> defs;
      cmSystemTools::ExpandListArgument(cdefs, defs);

      // Recompose the list without the definition.
      std::vector<std::string>::const_iterator defEnd =
        std::remove(defs.begin(), defs.end(), define);
      std::vector<std::string>::const_iterator defBegin = defs.begin();
      std::string ndefs = cmJoin(cmMakeRange(defBegin, defEnd), ";");

      // Store the new list.
      this->SetProperty("COMPILE_DEFINITIONS", ndefs.c_str());
    }
  } else {
    // Append the definition to the directory property.
    this->AppendProperty("COMPILE_DEFINITIONS", define);
  }

  return true;
}